

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_19bca9::readWholeFiles(string *fn)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  float *pfVar10;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar11;
  Channel *pCVar12;
  ostream *poVar13;
  void *this_00;
  ChannelList *this_01;
  ChannelList *pCVar14;
  size_type sVar15;
  reference pvVar16;
  reference __b;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledInputPart part_1;
  FrameBuffer frameBuffer_1;
  InputPart part;
  FrameBuffer frameBuffer;
  int partNumber;
  int i;
  int b;
  int a;
  int i_3;
  int i_2;
  int nHeaders;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Channel c2;
  Channel c1;
  ConstIterator i2;
  ConstIterator i1;
  Header *header;
  size_t i_1;
  MultiPartInputFile file;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  undefined4 in_stack_fffffffffffffc58;
  int iVar17;
  int height;
  int in_stack_fffffffffffffc5c;
  undefined1 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc61;
  undefined1 in_stack_fffffffffffffc62;
  undefined1 in_stack_fffffffffffffc63;
  int in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  ostream *in_stack_fffffffffffffd38;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffd40;
  Array2D<float> *in_stack_fffffffffffffd48;
  Array2D<unsigned_int> *in_stack_fffffffffffffd50;
  ostream *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd70;
  int local_180;
  int local_17c;
  FrameBuffer local_170;
  FrameBuffer local_138;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  vector<int,_std::allocator<int>_> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_90;
  ulong local_88;
  MultiPartInputFile local_80 [32];
  Array2D<Imath_3_2::half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_3_4::Array2D<float>::Array2D(&local_38);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D(&local_60);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_80,pcVar9,iVar6,true);
  local_88 = 0;
  while( true ) {
    uVar2 = local_88;
    iVar6 = Imf_3_4::MultiPartInputFile::parts();
    if ((ulong)(long)iVar6 <= uVar2) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::operator<<(poVar13,std::flush<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1cbc6f);
      sVar15 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                         ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                          (anonymous_namespace)::headers);
      local_e4 = (int)sVar15;
      for (local_e8 = 0; local_e8 < local_e4; local_e8 = local_e8 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      }
      for (local_ec = 0; local_ec < local_e4; local_ec = local_ec + 1) {
        local_f0 = random_int(in_stack_fffffffffffffc64);
        local_f4 = random_int(in_stack_fffffffffffffc64);
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,(long)local_f0);
        __b = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,(long)local_f4);
        std::swap<int>(pvVar16,__b);
      }
      local_f8 = 0;
      do {
        if (local_e4 <= local_f8) {
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffc64,
                              CONCAT13(in_stack_fffffffffffffc63,
                                       CONCAT12(in_stack_fffffffffffffc62,
                                                CONCAT11(in_stack_fffffffffffffc61,
                                                         in_stack_fffffffffffffc60)))));
          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                    ((Array2D<Imath_3_2::half> *)
                     CONCAT44(in_stack_fffffffffffffc64,
                              CONCAT13(in_stack_fffffffffffffc63,
                                       CONCAT12(in_stack_fffffffffffffc62,
                                                CONCAT11(in_stack_fffffffffffffc61,
                                                         in_stack_fffffffffffffc60)))));
          Imf_3_4::Array2D<float>::~Array2D
                    ((Array2D<float> *)
                     CONCAT44(in_stack_fffffffffffffc64,
                              CONCAT13(in_stack_fffffffffffffc63,
                                       CONCAT12(in_stack_fffffffffffffc62,
                                                CONCAT11(in_stack_fffffffffffffc61,
                                                         in_stack_fffffffffffffc60)))));
          Imf_3_4::Array2D<unsigned_int>::~Array2D
                    ((Array2D<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffc64,
                              CONCAT13(in_stack_fffffffffffffc63,
                                       CONCAT12(in_stack_fffffffffffffc62,
                                                CONCAT11(in_stack_fffffffffffffc61,
                                                         in_stack_fffffffffffffc60)))));
          return;
        }
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,(long)local_f8);
        local_fc = *pvVar16;
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                             (long)local_fc);
        if (*pvVar16 == 0) {
          Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1cbdf9);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                     (long)local_fc);
          iVar17 = 0x107;
          setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffd60,
                              (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                              in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                              in_stack_fffffffffffffd40,
                              (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                              (int)in_stack_fffffffffffffd70);
          Imf_3_4::InputPart::InputPart((InputPart *)&local_138,local_80,local_fc);
          Imf_3_4::InputPart::setFrameBuffer(&local_138);
          Imf_3_4::InputPart::readPixels((int)&local_138,0);
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::pixelTypes,(long)local_fc);
          iVar6 = *pvVar16;
          if (iVar6 == 0) {
            bVar3 = checkPixels<unsigned_int>
                              ((Array2D<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffc64,
                                        CONCAT13(in_stack_fffffffffffffc63,
                                                 CONCAT12(in_stack_fffffffffffffc62,
                                                          CONCAT11(in_stack_fffffffffffffc61,
                                                                   in_stack_fffffffffffffc60)))),
                               in_stack_fffffffffffffc5c,iVar17);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e1,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else if (iVar6 == 1) {
            bVar3 = checkPixels<float>((Array2D<float> *)
                                       CONCAT44(in_stack_fffffffffffffc64,
                                                CONCAT13(in_stack_fffffffffffffc63,
                                                         CONCAT12(in_stack_fffffffffffffc62,
                                                                  CONCAT11(in_stack_fffffffffffffc61
                                                                           ,
                                                  in_stack_fffffffffffffc60)))),
                                       in_stack_fffffffffffffc5c,iVar17);
            if (!bVar3) {
              __assert_fail("checkPixels<float> (fData, width, height)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e4,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else if ((iVar6 == 2) &&
                  (bVar3 = checkPixels<Imath_3_2::half>
                                     ((Array2D<Imath_3_2::half> *)
                                      CONCAT44(in_stack_fffffffffffffc64,
                                               CONCAT13(in_stack_fffffffffffffc63,
                                                        CONCAT12(in_stack_fffffffffffffc62,
                                                                 CONCAT11(in_stack_fffffffffffffc61,
                                                                          in_stack_fffffffffffffc60)
                                                                ))),in_stack_fffffffffffffc5c,iVar17
                                     ), !bVar3)) {
            __assert_fail("checkPixels<half> (hData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e7,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1cbfe2);
        }
        else {
          Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1cbff4);
          Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&local_170,local_80,local_fc);
          iVar6 = Imf_3_4::TiledInputPart::numXLevels();
          iVar17 = Imf_3_4::TiledInputPart::numYLevels();
          for (local_17c = 0; local_17c < iVar6; local_17c = local_17c + 1) {
            for (local_180 = 0; local_180 < iVar17; local_180 = local_180 + 1) {
              bVar4 = Imf_3_4::TiledInputPart::isValidLevel((int)&local_170,local_17c);
              if ((bVar4 & 1) != 0) {
                in_stack_fffffffffffffc74 = Imf_3_4::TiledInputPart::levelWidth((int)&local_170);
                in_stack_fffffffffffffc70 = Imf_3_4::TiledInputPart::levelHeight((int)&local_170);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                           (long)local_fc);
                setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffd60,
                                    (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                    in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                    in_stack_fffffffffffffd40,
                                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                                    (int)in_stack_fffffffffffffd70);
                Imf_3_4::TiledInputPart::setFrameBuffer(&local_170);
                iVar7 = Imf_3_4::TiledInputPart::numXTiles((int)&local_170);
                iVar8 = Imf_3_4::TiledInputPart::numYTiles((int)&local_170);
                height = local_180;
                Imf_3_4::TiledInputPart::readTiles
                          ((int)&local_170,0,iVar7 + -1,0,iVar8 + -1,local_17c);
                pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::pixelTypes,(long)local_fc);
                in_stack_fffffffffffffc64 = *pvVar16;
                if (in_stack_fffffffffffffc64 == 0) {
                  in_stack_fffffffffffffc63 =
                       checkPixels<unsigned_int>
                                 ((Array2D<unsigned_int> *)
                                  (ulong)CONCAT13(in_stack_fffffffffffffc63,
                                                  CONCAT12(in_stack_fffffffffffffc62,
                                                           CONCAT11(in_stack_fffffffffffffc61,
                                                                    in_stack_fffffffffffffc60))),
                                  in_stack_fffffffffffffc5c,height);
                  if (!(bool)in_stack_fffffffffffffc63) {
                    __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                  ,0x30b,
                                  "void (anonymous namespace)::readWholeFiles(const std::string &)")
                    ;
                  }
                }
                else if (in_stack_fffffffffffffc64 == 1) {
                  in_stack_fffffffffffffc62 =
                       checkPixels<float>((Array2D<float> *)
                                          CONCAT44(1,CONCAT13(in_stack_fffffffffffffc63,
                                                              CONCAT12(in_stack_fffffffffffffc62,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffc61,
                                                  in_stack_fffffffffffffc60)))),
                                          in_stack_fffffffffffffc5c,height);
                  if (!(bool)in_stack_fffffffffffffc62) {
                    __assert_fail("checkPixels<float> (fData, w, h)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                  ,0x30e,
                                  "void (anonymous namespace)::readWholeFiles(const std::string &)")
                    ;
                  }
                }
                else if ((in_stack_fffffffffffffc64 == 2) &&
                        (in_stack_fffffffffffffc61 =
                              checkPixels<Imath_3_2::half>
                                        ((Array2D<Imath_3_2::half> *)
                                         CONCAT44(2,CONCAT13(in_stack_fffffffffffffc63,
                                                             CONCAT12(in_stack_fffffffffffffc62,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffc61,
                                                  in_stack_fffffffffffffc60)))),
                                         in_stack_fffffffffffffc5c,height),
                        !(bool)in_stack_fffffffffffffc61)) {
                  __assert_fail("checkPixels<half> (hData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x311,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
            }
          }
          Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1cc3ee);
        }
        local_f8 = local_f8 + 1;
      } while( true );
    }
    local_90 = Imf_3_4::MultiPartInputFile::header((int)local_80);
    Imf_3_4::Header::displayWindow();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    Imf_3_4::Header::displayWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (!bVar3) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_4::Header::dataWindow();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    Imf_3_4::Header::dataWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (!bVar3) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar10 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar1 = *pfVar10;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    pfVar10 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar10) || (NAN(fVar1) || NAN(*pfVar10))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    this = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
    bVar3 = Imath_3_2::Vec2<float>::operator==(this,v);
    if (!bVar3) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    pfVar10 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar1 = *pfVar10;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    pfVar10 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar1 != *pfVar10) || (NAN(fVar1) || NAN(*pfVar10))) break;
    piVar11 = (int *)Imf_3_4::Header::lineOrder();
    iVar6 = *piVar11;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    piVar11 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar6 != *piVar11) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    piVar11 = (int *)Imf_3_4::Header::compression();
    iVar6 = *piVar11;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    piVar11 = (int *)Imf_3_4::Header::compression();
    if (iVar6 != *piVar11) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_4::Header::channels();
    local_98 = Imf_3_4::ChannelList::begin();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    Imf_3_4::Header::channels();
    local_a8 = Imf_3_4::ChannelList::begin();
    Imf_3_4::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)
               CONCAT44(in_stack_fffffffffffffc64,
                        CONCAT13(in_stack_fffffffffffffc63,
                                 CONCAT12(in_stack_fffffffffffffc62,
                                          CONCAT11(in_stack_fffffffffffffc61,
                                                   in_stack_fffffffffffffc60)))),
               (Iterator *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    pCVar12 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1cb836);
    local_b8 = *(undefined8 *)pCVar12;
    uStack_b0 = *(undefined8 *)(pCVar12 + 8);
    pCVar12 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1cb860);
    local_c8 = *(undefined8 *)pCVar12;
    uStack_c0 = *(undefined8 *)(pCVar12 + 8);
    bVar4 = Imf_3_4::Channel::operator==((Channel *)&local_b8,(Channel *)&local_c8);
    if ((bVar4 & 1) == 0) {
      poVar13 = std::operator<<((ostream *)&std::cout," type ");
      in_stack_fffffffffffffd70 = (ostream *)std::ostream::operator<<(poVar13,(int)local_b8);
      poVar13 = std::operator<<(in_stack_fffffffffffffd70,", ");
      in_stack_fffffffffffffd60 = (ostream *)std::ostream::operator<<(poVar13,(int)local_c8);
      in_stack_fffffffffffffd58 = std::operator<<(in_stack_fffffffffffffd60," xSampling ");
      in_stack_fffffffffffffd50 =
           (Array2D<unsigned_int> *)
           std::ostream::operator<<(in_stack_fffffffffffffd58,local_b8._4_4_);
      in_stack_fffffffffffffd48 =
           (Array2D<float> *)std::operator<<((ostream *)in_stack_fffffffffffffd50,", ");
      in_stack_fffffffffffffd40 =
           (Array2D<Imath_3_2::half> *)
           std::ostream::operator<<(in_stack_fffffffffffffd48,local_c8._4_4_);
      in_stack_fffffffffffffd38 =
           std::operator<<((ostream *)in_stack_fffffffffffffd40," ySampling ");
      poVar13 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd38,(int)uStack_b0);
      poVar13 = std::operator<<(poVar13,", ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)uStack_c0);
      poVar13 = std::operator<<(poVar13," pLinear ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(bool)(uStack_b0._4_1_ & 1));
      poVar13 = std::operator<<(poVar13,", ");
      this_00 = (void *)std::ostream::operator<<(poVar13,(bool)(uStack_c0._4_1_ & 1));
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
    this_01 = (ChannelList *)Imf_3_4::Header::channels();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    pCVar14 = (ChannelList *)Imf_3_4::Header::channels();
    bVar4 = Imf_3_4::ChannelList::operator==(this_01,pCVar14);
    if ((bVar4 & 1) == 0) {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2af,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_4::Header::name_abi_cxx11_();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    Imf_3_4::Header::name_abi_cxx11_();
    _Var5 = std::operator==(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    if (!_Var5) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    Imf_3_4::Header::type_abi_cxx11_();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_88);
    Imf_3_4::Header::type_abi_cxx11_();
    _Var5 = std::operator==(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    if (!_Var5) {
      __assert_fail("header.type () == headers[i].type ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
    }
    local_88 = local_88 + 1;
  }
  __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
}

Assistant:

void
readWholeFiles (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    MultiPartInputFile file (fn.c_str ());
    for (size_t i = 0; i < static_cast<size_t> (file.parts ()); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());

        //
        // It rarely fails here. Added code to see what's wrong when it happens.
        //
        ChannelList::ConstIterator i1 = header.channels ().begin ();
        ChannelList::ConstIterator i2 = headers[i].channels ().begin ();
        Channel                    c1 = i1.channel ();
        Channel                    c2 = i2.channel ();
        if (!(c1 == c2))
        {
            cout << " type " << c1.type << ", " << c2.type << " xSampling "
                 << c1.xSampling << ", " << c2.xSampling << " ySampling "
                 << c1.ySampling << ", " << c2.ySampling << " pLinear "
                 << c1.pLinear << ", " << c2.pLinear << flush;
        }

        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        assert (header.type () == headers[i].type ());
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    int         nHeaders = static_cast<int> (headers.size ());
    for (int i = 0; i < nHeaders; i++)
        shuffledPartNumber.push_back (i);
    for (int i = 0; i < nHeaders; i++)
    {
        int a = random_int (nHeaders);
        int b = random_int (nHeaders);
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int i;
    int partNumber;
    try
    {
        for (i = 0; i < nHeaders; i++)
        {
            partNumber = shuffledPartNumber[i];
            if (partTypes[partNumber] == 0)
            {
                FrameBuffer frameBuffer;
                setInputFrameBuffer (
                    frameBuffer,
                    pixelTypes[partNumber],
                    uData,
                    fData,
                    hData,
                    width,
                    height);

                InputPart part (file, partNumber);
                part.setFrameBuffer (frameBuffer);
                part.readPixels (0, height - 1);
                switch (pixelTypes[partNumber])
                {
                    case 0:
                        assert (
                            checkPixels<unsigned int> (uData, width, height));
                        break;
                    case 1:
                        assert (checkPixels<float> (fData, width, height));
                        break;
                    case 2:
                        assert (checkPixels<half> (hData, width, height));
                        break;
                }
            }
            else
            {
                FrameBuffer    frameBuffer;
                TiledInputPart part (file, partNumber);
                int            numXLevels = part.numXLevels ();
                int            numYLevels = part.numYLevels ();
                for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                    for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                    {
                        if (!part.isValidLevel (xLevel, yLevel)) continue;

                        int w = part.levelWidth (xLevel);
                        int h = part.levelHeight (yLevel);

                        setInputFrameBuffer (
                            frameBuffer,
                            pixelTypes[partNumber],
                            uData,
                            fData,
                            hData,
                            width,
                            height);

                        part.setFrameBuffer (frameBuffer);
                        int numXTiles = part.numXTiles (xLevel);
                        int numYTiles = part.numYTiles (yLevel);
                        part.readTiles (
                            0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                        switch (pixelTypes[partNumber])
                        {
                            case 0:
                                assert (
                                    checkPixels<unsigned int> (uData, w, h));
                                break;
                            case 1:
                                assert (checkPixels<float> (fData, w, h));
                                break;
                            case 2:
                                assert (checkPixels<half> (hData, w, h));
                                break;
                        }
                    }
            }
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}